

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_req_make2(httpreq **preq,char *method,size_t m_len,CURLU *url,
                            char *scheme_default)

{
  char **part;
  curl_strdup_callback p_Var1;
  CURLUcode CVar2;
  CURLcode CVar3;
  httpreq *req;
  char *pcVar4;
  CURLcode CVar5;
  char *pass;
  char *user;
  char *port;
  char *host;
  dynbuf buf;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  dynbuf local_58;
  httpreq **local_38;
  
  if (m_len - 0x18 < 0xffffffffffffffe7) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  local_38 = preq;
  req = (httpreq *)(*Curl_ccalloc)(1,0xa0);
  CVar3 = CURLE_OUT_OF_MEMORY;
  if (req == (httpreq *)0x0) goto LAB_00138661;
  memcpy(req,method,m_len);
  part = &req->scheme;
  CVar2 = curl_url_get(url,CURLUPART_SCHEME,part,0);
  if ((CVar2 != CURLUE_NO_SCHEME) && (CVar2 != CURLUE_OK)) goto LAB_00138661;
  if ((scheme_default != (char *)0x0) && (*part == (char *)0x0)) {
    pcVar4 = (*Curl_cstrdup)(scheme_default);
    *part = pcVar4;
    if (pcVar4 == (char *)0x0) goto LAB_00138661;
  }
  local_68 = (char *)0x0;
  local_60 = (char *)0x0;
  local_78 = (char *)0x0;
  local_70 = (char *)0x0;
  Curl_dyn_init(&local_58,0x100000);
  CVar2 = curl_url_get(url,CURLUPART_HOST,&local_60,0);
  CVar3 = CURLE_URL_MALFORMAT;
  if ((CVar2 == CURLUE_NO_HOST) || (CVar2 == CURLUE_OK)) {
    pcVar4 = (char *)0x0;
    if (local_60 == (char *)0x0) {
LAB_00138527:
      req->authority = pcVar4;
      CVar3 = CURLE_OK;
    }
    else {
      CVar2 = curl_url_get(url,CURLUPART_PORT,&local_68,2);
      if (((CVar2 == CURLUE_NO_PORT) || (CVar2 == CURLUE_OK)) &&
         ((CVar2 = curl_url_get(url,CURLUPART_USER,&local_70,0), CVar2 == CURLUE_NO_USER ||
          (CVar2 == CURLUE_OK)))) {
        if (local_70 != (char *)0x0) {
          CVar3 = CURLE_URL_MALFORMAT;
          CVar2 = curl_url_get(url,CURLUPART_PASSWORD,&local_78,0);
          if ((CVar2 != CURLUE_NO_PASSWORD) && (CVar2 != CURLUE_OK)) goto LAB_0013852e;
        }
        if ((((local_70 == (char *)0x0) ||
             ((CVar3 = Curl_dyn_add(&local_58,local_70), CVar3 == CURLE_OK &&
              (((local_78 == (char *)0x0 ||
                (CVar3 = Curl_dyn_addf(&local_58,":%s"), CVar3 == CURLE_OK)) &&
               (CVar3 = Curl_dyn_add(&local_58,"@"), CVar3 == CURLE_OK)))))) &&
            (CVar3 = Curl_dyn_add(&local_58,local_60), CVar3 == CURLE_OK)) &&
           ((local_68 == (char *)0x0 || (CVar3 = Curl_dyn_addf(&local_58,":%s"), CVar3 == CURLE_OK))
           )) {
          p_Var1 = Curl_cstrdup;
          pcVar4 = Curl_dyn_ptr(&local_58);
          pcVar4 = (*p_Var1)(pcVar4);
          goto LAB_00138527;
        }
      }
    }
  }
LAB_0013852e:
  (*Curl_cfree)(local_70);
  (*Curl_cfree)(local_78);
  (*Curl_cfree)(local_60);
  (*Curl_cfree)(local_68);
  Curl_dyn_free(&local_58);
  if (CVar3 != CURLE_OK) goto LAB_00138661;
  local_78 = (char *)0x0;
  local_70 = (char *)0x0;
  Curl_dyn_init(&local_58,0x100000);
  CVar2 = curl_url_get(url,CURLUPART_PATH,&local_70,0x10);
  CVar3 = CURLE_URL_MALFORMAT;
  if ((CVar2 == CURLUE_OK) &&
     (CVar2 = curl_url_get(url,CURLUPART_QUERY,&local_78,0), (CVar2 & ~CURLUE_NO_QUERY) == CURLUE_OK
     )) {
    if (local_70 == (char *)0x0 && local_78 == (char *)0x0) {
      req->path = (char *)0x0;
    }
    else if (local_70 == (char *)0x0 || local_78 != (char *)0x0) {
      if (local_70 == (char *)0x0) {
        CVar5 = CURLE_URL_MALFORMAT;
      }
      else {
        CVar3 = Curl_dyn_add(&local_58,local_70);
        if (CVar3 != CURLE_OK) goto LAB_0013861e;
        CVar5 = CURLE_OK;
      }
      if (local_78 != (char *)0x0) {
        CVar3 = Curl_dyn_addf(&local_58,"?%s");
        CVar5 = CURLE_OK;
        if (CVar3 != CURLE_OK) goto LAB_0013861e;
      }
      CVar3 = CVar5;
      p_Var1 = Curl_cstrdup;
      pcVar4 = Curl_dyn_ptr(&local_58);
      pcVar4 = (*p_Var1)(pcVar4);
      req->path = pcVar4;
      if (pcVar4 == (char *)0x0) goto LAB_0013861e;
    }
    else {
      req->path = local_70;
      local_70 = (char *)0x0;
    }
    CVar3 = CURLE_OK;
  }
LAB_0013861e:
  (*Curl_cfree)(local_70);
  (*Curl_cfree)(local_78);
  Curl_dyn_free(&local_58);
  if (CVar3 == CURLE_OK) {
    CVar3 = CURLE_OK;
    Curl_dynhds_init(&req->headers,0,0x100000);
    Curl_dynhds_init(&req->trailers,0,0x100000);
  }
LAB_00138661:
  if ((req != (httpreq *)0x0) && (CVar3 != CURLE_OK)) {
    Curl_http_req_free(req);
  }
  if (CVar3 != CURLE_OK) {
    req = (httpreq *)0x0;
  }
  *local_38 = req;
  return CVar3;
}

Assistant:

CURLcode Curl_http_req_make2(struct httpreq **preq,
                             const char *method, size_t m_len,
                             CURLU *url, const char *scheme_default)
{
  struct httpreq *req;
  CURLcode result = CURLE_OUT_OF_MEMORY;
  CURLUcode uc;

  DEBUGASSERT(method);
  if(m_len + 1 > sizeof(req->method))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  req = calloc(1, sizeof(*req));
  if(!req)
    goto out;
  memcpy(req->method, method, m_len);

  uc = curl_url_get(url, CURLUPART_SCHEME, &req->scheme, 0);
  if(uc && uc != CURLUE_NO_SCHEME)
    goto out;
  if(!req->scheme && scheme_default) {
    req->scheme = strdup(scheme_default);
    if(!req->scheme)
      goto out;
  }

  result = req_assign_url_authority(req, url);
  if(result)
    goto out;
  result = req_assign_url_path(req, url);
  if(result)
    goto out;

  Curl_dynhds_init(&req->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&req->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && req)
    Curl_http_req_free(req);
  *preq = result ? NULL : req;
  return result;
}